

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::GetProperty(Prim *prim,string *attr_name,Property *out_prop,string *err)

{
  vtable_type *pvVar1;
  pointer pXVar2;
  undefined1 uVar3;
  bool bVar4;
  uint32_t uVar5;
  int iVar6;
  Model *pMVar7;
  const_iterator cVar8;
  Xformable *this;
  Scope *pSVar9;
  ostream *poVar10;
  GeomMesh *pGVar11;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *this_00;
  GeomSubset *pGVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  Shader *shader;
  Material *material;
  undefined8 uVar14;
  SkelRoot *skelroot;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *pvVar15;
  BlendShape *blendshape;
  Skeleton *skel;
  SkelAnimation *anim;
  char *__function;
  ElementType extraout_EDX;
  ElementType extraout_EDX_00;
  ElementType extraout_EDX_01;
  ElementType v;
  OpType *extraout_RDX;
  OpType *extraout_RDX_00;
  OpType *extraout_RDX_01;
  OpType *op;
  string *extraout_RDX_02;
  string *extraout_RDX_03;
  string *err_00;
  string *extraout_RDX_04;
  string *extraout_RDX_05;
  string *extraout_RDX_06;
  string *extraout_RDX_07;
  string *err_01;
  string *err_02;
  string *err_03;
  string *psVar16;
  long lVar17;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *input;
  TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *input_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  pointer this_01;
  long lVar18;
  AttrMetas *pAVar19;
  ulong uVar20;
  string op_name;
  token tok;
  string err_1;
  string err_2;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  ostringstream ss_e;
  storage_union local_978;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_968;
  GeomMesh *local_958;
  undefined1 local_950 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_940;
  undefined1 local_930 [24];
  bool local_918;
  undefined1 local_910 [32];
  Prim *local_8f0;
  key_type *local_8e8;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_8e0;
  storage_union local_8d8;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [32];
  Variability local_898;
  bool local_894;
  _Alloc_hider local_890;
  size_type local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  storage_union local_870;
  vtable_type *local_860;
  bool local_858;
  undefined1 local_850 [32];
  undefined1 local_830 [24];
  AttrMetas AStack_818;
  undefined1 local_610 [8];
  undefined1 local_608 [24];
  undefined1 local_5f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_5d8;
  any local_5c8;
  bool local_5b0;
  undefined1 local_5a8 [24];
  bool local_590;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> vStack_588;
  AttrMetas local_570;
  ListEditQual local_368;
  Type TStack_364;
  Type local_360;
  Path PStack_358;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> vStack_288;
  ListEditQual local_270;
  AttrMetas AStack_268;
  bool local_60;
  bool local_38;
  
  pvVar1 = (prim->_data).v_.vtable;
  if (pvVar1 == (vtable_type *)0x0) {
LAB_003176f0:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_610,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
    poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x79a);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_610,"TODO: Prim type ",0x10);
    pvVar1 = (prim->_data).v_.vtable;
    if (pvVar1 == (vtable_type *)0x0) {
      local_8b8._0_8_ = local_8b8 + 0x10;
      local_8b8._8_8_ = (char *)0x4;
      local_8b8._16_5_ = 0x64696f76;
    }
    else {
      (*pvVar1->type_name)((string *)local_8b8);
    }
    poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,(char *)local_8b8._0_8_,local_8b8._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
      operator_delete((void *)local_8b8._0_8_,local_8b8._16_8_ + 1);
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,local_8b8._0_8_);
      if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
        operator_delete((void *)local_8b8._0_8_,local_8b8._16_8_ + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
    ::std::ios_base::~ios_base((ios_base *)(local_5a8 + 8));
    return false;
  }
  uVar5 = (*pvVar1->type_id)();
  if (uVar5 == 0x401) {
    pMVar7 = tinyusdz::value::Value::as<tinyusdz::Model>(&prim->_data,false);
    if (out_prop == (Property *)0x0) {
      local_898 = local_898 & 0xffffff00;
      ::std::__cxx11::string::string
                ((string *)local_610,"[InternalError] nullptr in output Property is not allowed.",
                 (allocator *)local_950);
      local_8b8._0_8_ = local_610;
      if (local_610 == (undefined1  [8])(local_608 + 8)) {
        local_8b8._24_8_ = local_608._16_8_;
        local_8b8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_8b8 + 0x10);
      }
      local_8b8._16_8_ = local_608._8_8_;
      local_8b8._8_8_ = local_608._0_8_;
      if ((local_898 & Uniform) != Varying) {
        bVar4 = true;
        if ((local_8b8._0_8_ & 1) != 0) goto LAB_00314c60;
        goto LAB_00313cfa;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_610,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
      iVar6 = 0x78f;
LAB_00313f26:
      poVar10 = (ostream *)::std::ostream::operator<<(local_610,iVar6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      if ((bool)(undefined1)local_898 == true) goto LAB_00317bb8;
      poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,(char *)local_8b8._0_8_,local_8b8._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
LAB_00313f83:
      if (err == (string *)0x0) goto LAB_00314c3d;
      ::std::__cxx11::stringbuf::str();
LAB_00314c1e:
      ::std::__cxx11::string::_M_append((char *)err,local_950._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_950._0_8_ == &local_940) goto LAB_00314c3d;
LAB_00314c30:
      operator_delete((void *)local_950._0_8_,local_940._M_allocated_capacity + 1);
    }
    else {
      cVar8 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)&pMVar7->props,attr_name);
      if ((_Rb_tree_header *)cVar8._M_node != &(pMVar7->props)._M_t._M_impl.super__Rb_tree_header) {
LAB_003137f3:
        ::std::__cxx11::string::_M_assign((string *)out_prop);
        (out_prop->_attrib)._varying_authored = (bool)cVar8._M_node[3].field_0x4;
        (out_prop->_attrib)._variability = cVar8._M_node[3]._M_color;
        ::std::__cxx11::string::_M_assign((string *)&(out_prop->_attrib)._type_name);
        linb::any::operator=((any *)&(out_prop->_attrib)._var,(any *)&cVar8._M_node[4]._M_parent);
        (out_prop->_attrib)._var._blocked = SUB41(cVar8._M_node[5]._M_color,0);
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::operator=(&(out_prop->_attrib)._var._ts._samples,
                    (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&cVar8._M_node[5]._M_parent);
        (out_prop->_attrib)._var._ts._dirty = SUB41(cVar8._M_node[6]._M_color,0);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &(out_prop->_attrib)._paths,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &cVar8._M_node[6]._M_parent);
        AttrMetas::operator=(&(out_prop->_attrib)._metas,(AttrMetas *)(cVar8._M_node + 7));
        *(_Base_ptr *)&out_prop->_listOpQual = cVar8._M_node[0x17]._M_parent;
        (out_prop->_rel).type = *(Type *)&cVar8._M_node[0x17]._M_left;
        Path::operator=(&(out_prop->_rel).targetPath,(Path *)&cVar8._M_node[0x17]._M_right);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &(out_prop->_rel).targetPathVector,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &cVar8._M_node[0x1e]._M_parent);
        (out_prop->_rel).listOpQual = cVar8._M_node[0x1f]._M_color;
        AttrMetas::operator=(&(out_prop->_rel)._metas,(AttrMetas *)&cVar8._M_node[0x1f]._M_parent);
        (out_prop->_rel)._varying_authored = *(bool *)&cVar8._M_node[0x2f]._M_left;
        ::std::__cxx11::string::_M_assign((string *)&out_prop->_prop_value_type_name);
        out_prop->_has_custom = *(bool *)&cVar8._M_node[0x30]._M_right;
        bVar4 = true;
        local_898 = CONCAT31(local_898._1_3_,1);
        local_8b8[0] = 1;
        goto LAB_00314c60;
      }
      local_898 = CONCAT31(local_898._1_3_,1);
      local_8b8._0_8_ = local_8b8._0_8_ & 0xffffffffffffff00;
LAB_00313cfa:
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_610,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x78f);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_978.dynamic = &aStack_968;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_978,"Attribute `{}` does not exist in Prim {}({})","");
      local_910._16_4_ = 0x65646f4d;
      local_910[0x14] = 'l';
LAB_00313dd9:
      local_910[0x15] = '\0';
      local_910._8_8_ = 5;
LAB_00313de1:
      local_910._0_8_ =
           (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_910 + 0x10);
      fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                ((string *)local_950,(fmt *)&local_978,attr_name,&(prim->_elementPath)._prim_part,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_910,
                 in_R9);
      poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,(char *)local_950._0_8_,local_950._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_950._0_8_ != &local_940) {
        operator_delete((void *)local_950._0_8_,local_940._M_allocated_capacity + 1);
      }
      if ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_910._0_8_ !=
          (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_910 + 0x10)) {
        operator_delete((void *)local_910._0_8_,
                        CONCAT17(local_910[0x17],
                                 CONCAT16(local_910[0x16],
                                          CONCAT15(local_910[0x15],
                                                   CONCAT14(local_910[0x14],local_910._16_4_)))) + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_978.dynamic != &aStack_968) {
        operator_delete(local_978.dynamic,
                        CONCAT71(aStack_968._M_allocated_capacity._1_7_,aStack_968._M_local_buf[0])
                        + 1);
      }
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
LAB_00313e94:
        ::std::__cxx11::string::_M_append((char *)err,local_950._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_950._0_8_ != &local_940) goto LAB_00314c30;
      }
    }
  }
  else {
    pvVar1 = (prim->_data).v_.vtable;
    if (pvVar1 == (vtable_type *)0x0) goto LAB_003176f0;
    uVar5 = (*pvVar1->type_id)();
    if (uVar5 != 0x404) {
      pvVar1 = (prim->_data).v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) goto LAB_003176f0;
      uVar5 = (*pvVar1->type_id)();
      if (uVar5 == 0x402) {
        pSVar9 = tinyusdz::value::Value::as<tinyusdz::Scope>(&prim->_data,false);
        if (out_prop == (Property *)0x0) {
          local_898 = local_898 & 0xffffff00;
          ::std::__cxx11::string::string
                    ((string *)local_610,
                     "[InternalError] nullptr in output Property is not allowed.",
                     (allocator *)local_950);
          local_8b8._0_8_ = local_610;
          if (local_610 == (undefined1  [8])(local_608 + 8)) {
            local_8b8._24_8_ = local_608._16_8_;
            local_8b8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_8b8 + 0x10);
          }
          local_8b8._16_8_ = local_608._8_8_;
          local_8b8._8_8_ = local_608._0_8_;
          if ((local_898 & Uniform) == Varying) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_610,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                       ,0x5c);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_610,"GetProperty",0xb);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
            iVar6 = 0x791;
            goto LAB_00313f26;
          }
          bVar4 = true;
          if ((local_8b8._0_8_ & 1) != 0) goto LAB_00314c60;
        }
        else {
          cVar8 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          *)&pSVar9->props,attr_name);
          if ((_Rb_tree_header *)cVar8._M_node !=
              &(pSVar9->props)._M_t._M_impl.super__Rb_tree_header) goto LAB_003137f3;
          local_898 = CONCAT31(local_898._1_3_,1);
          local_8b8._0_8_ = local_8b8._0_8_ & 0xffffffffffffff00;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_610,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb)
        ;
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x791);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_978.dynamic = &aStack_968;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_978,"Attribute `{}` does not exist in Prim {}({})","");
        local_910._16_4_ = 0x706f6353;
        local_910[0x14] = 'e';
        goto LAB_00313dd9;
      }
      pvVar1 = (prim->_data).v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) goto LAB_003176f0;
      uVar5 = (*pvVar1->type_id)();
      if (uVar5 == 0x405) {
        pGVar11 = tinyusdz::value::Value::as<tinyusdz::GeomMesh>(&prim->_data,false);
        if (out_prop == (Property *)0x0) {
          local_898 = local_898 & 0xffffff00;
          ::std::__cxx11::string::string
                    ((string *)local_610,
                     "[InternalError] nullptr in output Property is not allowed.",
                     (allocator *)local_950);
          if (local_610 == (undefined1  [8])(local_608 + 8)) {
            local_8b8._24_8_ = local_608._16_8_;
            local_8b8._0_8_ = local_8b8 + 0x10;
          }
          else {
            local_8b8._0_8_ = local_610;
          }
          local_8b8._16_8_ = local_608._8_8_;
          local_8b8._8_8_ = local_608._0_8_;
        }
        else {
          local_910._0_8_ = local_910 + 0x10;
          local_910._8_8_ = 0;
          local_910._16_4_ = local_910._16_4_ & 0xffffff00;
          local_958 = pGVar11;
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            local_8b8._0_8_ = local_8b8 + 0x10;
            local_8b8._8_8_ = (char *)0x0;
            local_8b8._16_8_ = local_8b8._16_8_ & 0xffffffffffffff00;
            local_894 = false;
            local_890._M_p = (pointer)&local_880;
            local_888 = 0;
            local_880._M_local_buf[0] = '\0';
            local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_870.dynamic = (void *)0x0;
            local_858 = false;
            local_850._0_8_ = (pointer)0x0;
            local_850[8] = 0;
            local_850._9_7_ = 0;
            local_850[0x10] = 0;
            local_850._17_8_ = 0;
            AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
            AStack_818.elementSize.has_value_ = false;
            AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
            AStack_818.hidden.has_value_ = false;
            AStack_818.hidden.contained = (storage_t<bool>)0x0;
            AStack_818.comment.has_value_ = false;
            AStack_818.weight.contained = (storage_t<double>)0x0;
            AStack_818.connectability.has_value_ = false;
            AStack_818.bindMaterialAs.contained._16_8_ = 0;
            AStack_818.bindMaterialAs.contained._24_8_ = 0;
            AStack_818.bindMaterialAs.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.bindMaterialAs.contained._8_8_ = 0;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.comment.contained._8_8_ = 0;
            AStack_818.comment.contained._16_8_ = 0;
            AStack_818.comment.contained._24_8_ = 0;
            AStack_818.comment.contained._32_8_ = 0;
            AStack_818.comment.contained._40_8_ = 0;
            AStack_818.customData.has_value_ = false;
            AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
            ;
            AStack_818.customData.contained._8_8_ = 0;
            AStack_818.customData.contained._16_8_ = 0;
            AStack_818.customData.contained._24_8_ = 0;
            AStack_818.customData.contained._32_8_ = 0;
            AStack_818.customData.contained._40_8_ = 0;
            AStack_818.weight.has_value_ = false;
            AStack_818.connectability.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.connectability.contained._8_8_ = 0;
            AStack_818.connectability.contained._16_8_ = 0;
            AStack_818.connectability.contained._24_8_ = 0;
            AStack_818.outputName.has_value_ = false;
            AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
            ;
            AStack_818.outputName.contained._8_8_ = 0;
            AStack_818.outputName.contained._16_8_ = 0;
            AStack_818.outputName.contained._24_8_ = 0;
            AStack_818.renderType.has_value_ = false;
            AStack_818.sdrMetadata.has_value_ = false;
            AStack_818.renderType.contained._16_8_ = 0;
            AStack_818.renderType.contained._24_8_ = 0;
            AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
            ;
            AStack_818.renderType.contained._8_8_ = 0;
            AStack_818.displayName.has_value_ = false;
            AStack_818.sdrMetadata.contained._32_8_ = 0;
            AStack_818.sdrMetadata.contained._40_8_ = 0;
            AStack_818.sdrMetadata.contained._16_8_ = 0;
            AStack_818.sdrMetadata.contained._24_8_ = 0;
            AStack_818.sdrMetadata.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.sdrMetadata.contained._8_8_ = 0;
            AStack_818.displayGroup.has_value_ = false;
            AStack_818.displayName.contained._16_8_ = 0;
            AStack_818.displayName.contained._24_8_ = 0;
            AStack_818.displayName.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.displayName.contained._8_8_ = 0;
            AStack_818.bindMaterialAs.has_value_ = false;
            AStack_818.displayGroup.contained._16_8_ = 0;
            AStack_818.displayGroup.contained._24_8_ = 0;
            AStack_818.displayGroup.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.displayGroup.contained._8_8_ = 0;
            local_830[0x10] = 0;
            stack0xfffffffffffff7e1 = 0;
            local_830._0_8_ = (pointer)0x0;
            local_830[8] = 0;
            local_830._9_7_ = 0;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            AStack_818.stringData.
            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            AStack_818.stringData.
            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            AStack_818.stringData.
            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_898 = Varying;
            local_8f0 = prim;
            local_8e8 = attr_name;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            tinyusdz::value::
            TypeTraits<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
            ::type_name_abi_cxx11_();
            ::std::__cxx11::string::_M_assign((string *)&local_890);
            if (local_610 != (undefined1  [8])(local_608 + 8)) {
              operator_delete((void *)local_610,local_608._8_8_ + 1);
            }
            pGVar11 = local_958;
            if ((local_958->points)._blocked == true) {
              local_858 = true;
            }
            if ((local_958->points)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (local_958->points)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_start) {
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &(local_958->points)._paths);
            }
            local_940._M_allocated_capacity =
                 (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_950._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_940._M_local_buf[8] = '\0';
            local_930._0_8_ = (pointer)0x0;
            local_930[8] = 0;
            local_930._9_7_ = 0;
            local_930[0x10] = 0;
            stack0xfffffffffffff6e1 = 0;
            nonstd::optional_lite::
            optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
            ::optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                        *)local_610,&(pGVar11->points)._attrib);
            if ((string)local_610[0] == (string)0x1) {
              uVar3 = (string)0x1;
              if (local_5f0[1] == 1) {
                local_858 = true;
                if (local_5f0[0] != Varying) {
LAB_00315be9:
                  uVar3 = local_610[0];
                }
              }
              else if (local_5f0[0] != Varying) {
                local_978.dynamic =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_978._8_1_ = 0;
                local_978._9_7_ = 0;
                aStack_968._M_local_buf[0] = '\0';
                aStack_968._M_allocated_capacity._1_7_ = 0;
                ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
                operator=((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                           *)&local_978,
                          (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                           *)local_608);
                local_8c8._0_8_ =
                     linb::any::
                     vtable_for_type<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>()
                     ::table;
                pvVar15 = (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                           *)operator_new(0x18);
                ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
                vector((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                        *)pvVar15,
                       (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                        *)&local_978);
                local_8d8.dynamic = pvVar15;
                linb::any::operator=((any *)local_950,(any *)&local_8d8);
                if ((pointer)local_8c8._0_8_ != (pointer)0x0) {
                  (**(code **)&((pointer)(local_8c8._0_8_ + 0x18))->z)(&local_8d8);
                }
                pGVar11 = local_958;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_978.dynamic !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_978.dynamic,
                                  CONCAT71(aStack_968._M_allocated_capacity._1_7_,
                                           aStack_968._M_local_buf[0]) - local_978._0_8_);
                }
                goto LAB_00315be9;
              }
              if ((uVar3 & 1) != 0) {
                if (aStack_5d8._M_local_buf[8] == '\x01') {
                  TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                  ::update((TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                            *)(local_5f0 + 8));
                  uVar3 = local_610[0];
                }
                lVar17 = CONCAT71(local_5f0._9_7_,local_5f0[8]);
                lVar18 = CONCAT71(local_5f0._17_7_,local_5f0[0x10]);
                if (lVar18 != lVar17) {
                  if ((uVar3 & 1) == 0) goto LAB_00317bd7;
                  if (aStack_5d8._M_local_buf[8] == '\x01') {
                    TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                    ::update((TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                              *)(local_5f0 + 8));
                    lVar17 = CONCAT71(local_5f0._9_7_,local_5f0[8]);
                    lVar18 = CONCAT71(local_5f0._17_7_,local_5f0[0x10]);
                  }
                  aStack_968._M_local_buf[0] = '\0';
                  aStack_968._M_allocated_capacity._1_7_ = 0;
                  aStack_968._M_local_buf[8] = '\0';
                  local_978.dynamic =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_978._8_1_ = 0;
                  local_978._9_7_ = 0;
                  if (lVar18 != lVar17) {
                    lVar18 = 8;
                    uVar20 = 0;
                    do {
                      local_8e0 = *(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> **)
                                   (lVar17 + -8 + lVar18);
                      local_8c8._0_8_ =
                           linb::any::
                           vtable_for_type<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>()
                           ::table;
                      pvVar15 = (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                 *)operator_new(0x18);
                      ::std::
                      vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
                      vector((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                              *)pvVar15,
                             (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                              *)(lVar17 + lVar18));
                      local_8d8.dynamic = pvVar15;
                      tinyusdz::value::TimeSamples::add_sample
                                ((TimeSamples *)&local_978,(double)local_8e0,(Value *)&local_8d8);
                      if ((pointer)local_8c8._0_8_ != (pointer)0x0) {
                        (**(code **)&((pointer)(local_8c8._0_8_ + 0x18))->z)(&local_8d8);
                      }
                      uVar20 = uVar20 + 1;
                      lVar17 = CONCAT71(local_5f0._9_7_,local_5f0[8]);
                      lVar18 = lVar18 + 0x28;
                    } while (uVar20 < (ulong)((CONCAT71(local_5f0._17_7_,local_5f0[0x10]) - lVar17
                                              >> 3) * -0x3333333333333333));
                  }
                  ::std::
                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               *)local_930,
                              (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               *)&local_978);
                  local_918 = (bool)aStack_968._M_local_buf[8];
                  ::std::
                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&local_978);
                  pGVar11 = local_958;
                  uVar3 = local_610[0];
                }
                if ((uVar3 & 1) != 0) {
                  if (local_5f0[0] == Varying) {
                    if (aStack_5d8._M_local_buf[8] == '\x01') {
                      TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                      ::update((TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                                *)(local_5f0 + 8));
                    }
                    if (CONCAT71(local_5f0._17_7_,local_5f0[0x10]) ==
                        CONCAT71(local_5f0._9_7_,local_5f0[8])) goto LAB_00315da4;
                  }
                  Attribute::set_var((Attribute *)local_8b8,(PrimVar *)local_950);
                  goto LAB_00315da4;
                }
              }
LAB_00317bd7:
              __function = 
              "value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f>>>::value() [T = tinyusdz::Animatable<std::vector<tinyusdz::value::point3f>>]"
              ;
LAB_00317bec:
              __assert_fail("has_value()",
                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                            ,0x591,__function);
            }
LAB_00315da4:
            if ((string)local_610[0] == (string)0x1) {
              nonstd::optional_lite::detail::
              storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
              ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                *)local_608);
            }
            pAVar19 = &(pGVar11->points)._metas;
LAB_00315dc2:
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_930);
            if ((undefined8 *)local_940._M_allocated_capacity != (undefined8 *)0x0) {
              (**(code **)(local_940._M_allocated_capacity + 0x20))((storage_union *)local_950);
            }
            AttrMetas::operator=(&AStack_818,pAVar19);
            Property::Property((Property *)local_610,(Attribute *)local_8b8,false);
            Property::operator=(out_prop,(Property *)local_610);
            Property::~Property((Property *)local_610);
            AttrMetas::~AttrMetas(&AStack_818);
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_850);
            if (local_860 != (vtable_type *)0x0) {
              (*local_860->destroy)(&local_870);
              local_860 = (vtable_type *)0x0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_890._M_p != &local_880) {
              operator_delete(local_890._M_p,
                              CONCAT71(local_880._M_allocated_capacity._1_7_,
                                       local_880._M_local_buf[0]) + 1);
            }
            attr_name = local_8e8;
            if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
              operator_delete((void *)local_8b8._0_8_,local_8b8._16_8_ + 1);
            }
            goto LAB_00315ec2;
          }
          local_8f0 = prim;
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          psVar16 = extraout_RDX_02;
          if ((iVar6 == 0) ||
             (iVar6 = ::std::__cxx11::string::compare((char *)attr_name), psVar16 = extraout_RDX_03,
             iVar6 == 0)) {
            input = &local_958->faceVertexCounts;
            goto LAB_0031576c;
          }
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            local_8b8._0_8_ = local_8b8 + 0x10;
            local_8b8._8_8_ = (char *)0x0;
            local_8b8._16_8_ = local_8b8._16_8_ & 0xffffffffffffff00;
            local_894 = false;
            local_890._M_p = (pointer)&local_880;
            local_888 = 0;
            local_880._M_local_buf[0] = '\0';
            local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_870.dynamic = (void *)0x0;
            local_858 = false;
            local_850._0_8_ = (pointer)0x0;
            local_850[8] = 0;
            local_850._9_7_ = 0;
            local_850[0x10] = 0;
            local_850._17_8_ = 0;
            AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
            AStack_818.elementSize.has_value_ = false;
            AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
            AStack_818.hidden.has_value_ = false;
            AStack_818.hidden.contained = (storage_t<bool>)0x0;
            AStack_818.comment.has_value_ = false;
            AStack_818.weight.contained = (storage_t<double>)0x0;
            AStack_818.connectability.has_value_ = false;
            AStack_818.bindMaterialAs.contained._16_8_ = 0;
            AStack_818.bindMaterialAs.contained._24_8_ = 0;
            AStack_818.bindMaterialAs.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.bindMaterialAs.contained._8_8_ = 0;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.comment.contained._8_8_ = 0;
            AStack_818.comment.contained._16_8_ = 0;
            AStack_818.comment.contained._24_8_ = 0;
            AStack_818.comment.contained._32_8_ = 0;
            AStack_818.comment.contained._40_8_ = 0;
            AStack_818.customData.has_value_ = false;
            AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
            ;
            AStack_818.customData.contained._8_8_ = 0;
            AStack_818.customData.contained._16_8_ = 0;
            AStack_818.customData.contained._24_8_ = 0;
            AStack_818.customData.contained._32_8_ = 0;
            AStack_818.customData.contained._40_8_ = 0;
            AStack_818.weight.has_value_ = false;
            AStack_818.connectability.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.connectability.contained._8_8_ = 0;
            AStack_818.connectability.contained._16_8_ = 0;
            AStack_818.connectability.contained._24_8_ = 0;
            AStack_818.outputName.has_value_ = false;
            AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
            ;
            AStack_818.outputName.contained._8_8_ = 0;
            AStack_818.outputName.contained._16_8_ = 0;
            AStack_818.outputName.contained._24_8_ = 0;
            AStack_818.renderType.has_value_ = false;
            AStack_818.sdrMetadata.has_value_ = false;
            AStack_818.renderType.contained._16_8_ = 0;
            AStack_818.renderType.contained._24_8_ = 0;
            AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
            ;
            AStack_818.renderType.contained._8_8_ = 0;
            AStack_818.displayName.has_value_ = false;
            AStack_818.sdrMetadata.contained._32_8_ = 0;
            AStack_818.sdrMetadata.contained._40_8_ = 0;
            AStack_818.sdrMetadata.contained._16_8_ = 0;
            AStack_818.sdrMetadata.contained._24_8_ = 0;
            AStack_818.sdrMetadata.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.sdrMetadata.contained._8_8_ = 0;
            AStack_818.displayGroup.has_value_ = false;
            AStack_818.displayName.contained._16_8_ = 0;
            AStack_818.displayName.contained._24_8_ = 0;
            AStack_818.displayName.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.displayName.contained._8_8_ = 0;
            AStack_818.bindMaterialAs.has_value_ = false;
            AStack_818.displayGroup.contained._16_8_ = 0;
            AStack_818.displayGroup.contained._24_8_ = 0;
            AStack_818.displayGroup.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.displayGroup.contained._8_8_ = 0;
            local_830[0x10] = 0;
            stack0xfffffffffffff7e1 = 0;
            local_830._0_8_ = (pointer)0x0;
            local_830[8] = 0;
            local_830._9_7_ = 0;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            AStack_818.stringData.
            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            AStack_818.stringData.
            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            AStack_818.stringData.
            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_898 = Varying;
            local_8e8 = attr_name;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            tinyusdz::value::
            TypeTraits<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
            ::type_name_abi_cxx11_();
            ::std::__cxx11::string::_M_assign((string *)&local_890);
            if (local_610 != (undefined1  [8])(local_608 + 8)) {
              operator_delete((void *)local_610,local_608._8_8_ + 1);
            }
            pGVar11 = local_958;
            if ((local_958->normals)._blocked == true) {
              local_858 = true;
            }
            if ((local_958->normals)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (local_958->normals)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_start) {
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &(local_958->normals)._paths);
            }
            local_940._M_allocated_capacity =
                 (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_950._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_940._M_local_buf[8] = '\0';
            local_930._0_8_ = (pointer)0x0;
            local_930[8] = 0;
            local_930._9_7_ = 0;
            local_930[0x10] = 0;
            stack0xfffffffffffff6e1 = 0;
            nonstd::optional_lite::
            optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
            ::optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                        *)local_610,&(pGVar11->normals)._attrib);
            if ((string)local_610[0] == (string)0x1) {
              uVar3 = (string)0x1;
              if (local_5f0[1] == 1) {
                local_858 = true;
                if (local_5f0[0] != Varying) {
LAB_00316de2:
                  uVar3 = local_610[0];
                }
              }
              else if (local_5f0[0] != Varying) {
                local_978.dynamic =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_978._8_1_ = 0;
                local_978._9_7_ = 0;
                aStack_968._M_local_buf[0] = '\0';
                aStack_968._M_allocated_capacity._1_7_ = 0;
                ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                ::operator=((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                             *)&local_978,
                            (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                             *)local_608);
                local_8c8._0_8_ =
                     linb::any::
                     vtable_for_type<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>()
                     ::table;
                pvVar15 = (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                           *)operator_new(0x18);
                ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                ::vector(pvVar15,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                  *)&local_978);
                local_8d8.dynamic = pvVar15;
                linb::any::operator=((any *)local_950,(any *)&local_8d8);
                if ((pointer)local_8c8._0_8_ != (pointer)0x0) {
                  (**(code **)&((pointer)(local_8c8._0_8_ + 0x18))->z)(&local_8d8);
                }
                pGVar11 = local_958;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_978.dynamic !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_978.dynamic,
                                  CONCAT71(aStack_968._M_allocated_capacity._1_7_,
                                           aStack_968._M_local_buf[0]) - local_978._0_8_);
                }
                goto LAB_00316de2;
              }
              if ((uVar3 & 1) != 0) {
                if (aStack_5d8._M_local_buf[8] == '\x01') {
                  TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                  ::update((TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                            *)(local_5f0 + 8));
                  uVar3 = local_610[0];
                }
                lVar17 = CONCAT71(local_5f0._9_7_,local_5f0[8]);
                lVar18 = CONCAT71(local_5f0._17_7_,local_5f0[0x10]);
                if (lVar18 != lVar17) {
                  if ((uVar3 & 1) == 0) goto LAB_00317bf6;
                  if (aStack_5d8._M_local_buf[8] == '\x01') {
                    TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                    ::update((TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                              *)(local_5f0 + 8));
                    lVar17 = CONCAT71(local_5f0._9_7_,local_5f0[8]);
                    lVar18 = CONCAT71(local_5f0._17_7_,local_5f0[0x10]);
                  }
                  aStack_968._M_local_buf[0] = '\0';
                  aStack_968._M_allocated_capacity._1_7_ = 0;
                  aStack_968._M_local_buf[8] = '\0';
                  local_978.dynamic =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_978._8_1_ = 0;
                  local_978._9_7_ = 0;
                  if (lVar18 != lVar17) {
                    lVar18 = 8;
                    uVar20 = 0;
                    do {
                      local_8e0 = *(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> **)
                                   (lVar17 + -8 + lVar18);
                      local_8c8._0_8_ =
                           linb::any::
                           vtable_for_type<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>()
                           ::table;
                      pvVar15 = (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                 *)operator_new(0x18);
                      ::std::
                      vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      ::vector(pvVar15,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)(lVar17 + lVar18));
                      local_8d8.dynamic = pvVar15;
                      tinyusdz::value::TimeSamples::add_sample
                                ((TimeSamples *)&local_978,(double)local_8e0,(Value *)&local_8d8);
                      if ((pointer)local_8c8._0_8_ != (pointer)0x0) {
                        (**(code **)&((pointer)(local_8c8._0_8_ + 0x18))->z)(&local_8d8);
                      }
                      uVar20 = uVar20 + 1;
                      lVar17 = CONCAT71(local_5f0._9_7_,local_5f0[8]);
                      lVar18 = lVar18 + 0x28;
                    } while (uVar20 < (ulong)((CONCAT71(local_5f0._17_7_,local_5f0[0x10]) - lVar17
                                              >> 3) * -0x3333333333333333));
                  }
                  ::std::
                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               *)local_930,
                              (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               *)&local_978);
                  local_918 = (bool)aStack_968._M_local_buf[8];
                  ::std::
                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&local_978);
                  pGVar11 = local_958;
                  uVar3 = local_610[0];
                }
                if ((uVar3 & 1) != 0) {
                  if (local_5f0[0] == Varying) {
                    if (aStack_5d8._M_local_buf[8] == '\x01') {
                      TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                      ::update((TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                                *)(local_5f0 + 8));
                    }
                    if (CONCAT71(local_5f0._17_7_,local_5f0[0x10]) ==
                        CONCAT71(local_5f0._9_7_,local_5f0[8])) goto LAB_00316f9d;
                  }
                  Attribute::set_var((Attribute *)local_8b8,(PrimVar *)local_950);
                  goto LAB_00316f9d;
                }
              }
LAB_00317bf6:
              __function = 
              "value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f>>>::value() [T = tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f>>]"
              ;
              goto LAB_00317bec;
            }
LAB_00316f9d:
            if ((string)local_610[0] == (string)0x1) {
              nonstd::optional_lite::detail::
              storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
              ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                                *)local_608);
            }
            pAVar19 = &(pGVar11->normals)._metas;
            goto LAB_00315dc2;
          }
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            (anonymous_namespace)::
            ToProperty<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                      (&local_958->velocities,out_prop,err_00);
            goto LAB_00315ec2;
          }
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            input = &local_958->cornerIndices;
            psVar16 = extraout_RDX_04;
LAB_0031576c:
            (anonymous_namespace)::ToProperty<std::vector<int,std::allocator<int>>>
                      (input,out_prop,psVar16);
            goto LAB_00315ec2;
          }
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            input_00 = &local_958->cornerSharpnesses;
            psVar16 = extraout_RDX_05;
LAB_00317208:
            (anonymous_namespace)::ToProperty<std::vector<float,std::allocator<float>>>
                      (input_00,out_prop,psVar16);
            goto LAB_00315ec2;
          }
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            input = &local_958->creaseIndices;
            psVar16 = extraout_RDX_06;
            goto LAB_0031576c;
          }
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            input_00 = &local_958->creaseSharpnesses;
            psVar16 = extraout_RDX_07;
            goto LAB_00317208;
          }
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            (anonymous_namespace)::ToProperty<std::vector<int,std::allocator<int>>>
                      (&local_958->holeIndices,out_prop,err_01);
            goto LAB_00315ec2;
          }
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            bVar4 = anon_unknown_6::ToTokenProperty<tinyusdz::GeomMesh::InterpolateBoundary>
                              (&local_958->interpolateBoundary,out_prop,(string *)local_910);
            if (bVar4) goto LAB_00315ec2;
            local_978.dynamic = &aStack_968;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_978,"Convert Property {} failed: {}\n","");
            fmt::format<char[20],std::__cxx11::string>
                      ((string *)local_950,(fmt *)&local_978,(string *)"interpolateBoundary",
                       (char (*) [20])local_910,in_R8);
LAB_0031790a:
            local_8b8._16_8_ = local_940._M_allocated_capacity;
            local_8b8._8_8_ = local_950._8_8_;
            local_610 = (undefined1  [8])(local_608 + 8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_950._0_8_ == &local_940) {
              local_608._16_8_ = CONCAT71(local_940._9_7_,local_940._M_local_buf[8]);
              local_950._0_8_ = local_610;
            }
            local_950._8_8_ = (char *)0x0;
            local_940._M_allocated_capacity = local_940._M_allocated_capacity & 0xffffffffffffff00;
            local_898 = local_898 & 0xffffff00;
            local_8b8._0_8_ = local_950._0_8_;
            if ((undefined1  [8])local_950._0_8_ == local_610) {
              local_8b8._24_8_ = local_608._16_8_;
              local_8b8._0_8_ = local_8b8 + 0x10;
            }
            local_608._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_608._8_8_ = local_8b8._16_8_ & 0xffffffffffffff00;
            local_950._0_8_ = &local_940;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_978.dynamic != &aStack_968) {
              operator_delete(local_978.dynamic,
                              CONCAT71(aStack_968._M_allocated_capacity._1_7_,
                                       aStack_968._M_local_buf[0]) + 1);
            }
          }
          else {
            iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
            if (iVar6 == 0) {
              bVar4 = anon_unknown_6::ToTokenProperty<tinyusdz::GeomMesh::SubdivisionScheme>
                                (&local_958->subdivisionScheme,out_prop,err_02);
              if (bVar4) goto LAB_00315ec2;
              local_978.dynamic = &aStack_968;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_978,"Convert Property {} failed: {}\n","");
              fmt::format<char[18],std::__cxx11::string>
                        ((string *)local_950,(fmt *)&local_978,(string *)"subdivisionScheme",
                         (char (*) [18])local_910,in_R8);
              goto LAB_0031790a;
            }
            iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
            if (iVar6 == 0) {
              bVar4 = anon_unknown_6::
                      ToTokenProperty<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
                                (&local_958->faceVaryingLinearInterpolation,out_prop,
                                 (string *)local_910);
              if (bVar4) goto LAB_00315ec2;
              local_978.dynamic = &aStack_968;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_978,"Convert Property {} failed: {}\n","");
              fmt::format<char[31],std::__cxx11::string>
                        ((string *)local_950,(fmt *)&local_978,
                         (string *)"faceVaryingLinearInterpolation",(char (*) [31])local_910,in_R8);
              goto LAB_0031790a;
            }
            iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
            pGVar11 = local_958;
            if (iVar6 == 0) {
              if ((local_958->skeleton).has_value_ != true) goto LAB_00317a15;
              Property::Property((Property *)local_610,
                                 (Relationship *)&(local_958->skeleton).contained,false);
              Property::operator=(out_prop,(Property *)local_610);
              Property::~Property((Property *)local_610);
LAB_00315ec2:
              local_898 = CONCAT31(local_898._1_3_,1);
              local_8b8[0] = 1;
            }
            else {
              cVar8 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                              *)&(local_958->super_GPrim).props,attr_name);
              if ((_Rb_tree_header *)cVar8._M_node !=
                  &(pGVar11->super_GPrim).props._M_t._M_impl.super__Rb_tree_header) {
                Property::operator=(out_prop,(Property *)(cVar8._M_node + 2));
                goto LAB_00315ec2;
              }
LAB_00317a15:
              local_898 = CONCAT31(local_898._1_3_,1);
              local_8b8._0_8_ = local_8b8._0_8_ & 0xffffffffffffff00;
            }
          }
          prim = local_8f0;
          if ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_910._0_8_ !=
              (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_910 + 0x10)) {
            operator_delete((void *)local_910._0_8_,
                            CONCAT17(local_910[0x17],
                                     CONCAT16(local_910[0x16],
                                              CONCAT15(local_910[0x15],
                                                       CONCAT14(local_910[0x14],local_910._16_4_))))
                            + 1);
          }
        }
        if ((bool)(undefined1)local_898 != true) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_610,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                     ,0x5c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_610,"GetProperty",0xb);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
          iVar6 = 0x792;
          goto LAB_00314ba2;
        }
        bVar4 = true;
        if ((value_type_conflict)local_8b8[0] != false) goto LAB_00314c60;
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_610,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb)
        ;
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x792);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_978.dynamic = &aStack_968;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_978,"Attribute `{}` does not exist in Prim {}({})","");
        local_910._16_4_ = 0x6873654d;
        local_910._8_8_ = 4;
        local_910[0x14] = '\0';
LAB_00316a91:
        local_910._0_8_ =
             (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_910 + 0x10);
        fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  ((string *)local_950,(fmt *)&local_978,attr_name,&(prim->_elementPath)._prim_part,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_910,
                   in_R9);
        poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_610,(char *)local_950._0_8_,local_950._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_950._0_8_ != &local_940) {
          operator_delete((void *)local_950._0_8_,local_940._M_allocated_capacity + 1);
        }
        if ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_910._0_8_ !=
            (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_910 + 0x10)) {
          operator_delete((void *)local_910._0_8_,
                          CONCAT17(local_910[0x17],
                                   CONCAT16(local_910[0x16],
                                            CONCAT15(local_910[0x15],
                                                     CONCAT14(local_910[0x14],local_910._16_4_)))) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_978.dynamic != &aStack_968) {
          operator_delete(local_978.dynamic,
                          CONCAT71(aStack_968._M_allocated_capacity._1_7_,aStack_968._M_local_buf[0]
                                  ) + 1);
        }
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          goto LAB_00313e94;
        }
        goto LAB_00314c3d;
      }
      pvVar1 = (prim->_data).v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) goto LAB_003176f0;
      uVar5 = (*pvVar1->type_id)();
      if (uVar5 == 0x40e) {
        local_8f0 = prim;
        pGVar12 = tinyusdz::value::Value::as<tinyusdz::GeomSubset>(&prim->_data,false);
        if (out_prop == (Property *)0x0) {
          local_610 = (undefined1  [8])0x3eb856;
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::expected<const_char_*,_0>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_8b8,(unexpected_type<const_char_*> *)local_610);
          prim = local_8f0;
        }
        else {
          local_8d8.dynamic = local_8c8;
          local_8d8._8_8_ = 0;
          local_8c8._0_8_ = local_8c8._0_8_ & 0xffffffffffffff00;
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            (anonymous_namespace)::ToProperty<std::vector<int,std::allocator<int>>>
                      (&pGVar12->indices,out_prop,err_03);
          }
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            local_8b8._0_8_ = local_8b8 + 0x10;
            local_8b8._8_8_ = (char *)0x0;
            local_8b8._16_8_ = local_8b8._16_8_ & 0xffffffffffffff00;
            local_894 = false;
            local_888 = 0;
            local_880._M_local_buf[0] = '\0';
            local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_870.dynamic = (void *)0x0;
            local_858 = false;
            local_850._0_8_ = (pointer)0x0;
            local_850[8] = 0;
            local_850._9_7_ = 0;
            local_850[0x10] = 0;
            local_850._17_8_ = 0;
            AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
            AStack_818.elementSize.has_value_ = false;
            AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
            AStack_818.hidden.has_value_ = false;
            AStack_818.hidden.contained = (storage_t<bool>)0x0;
            AStack_818.comment.has_value_ = false;
            AStack_818.weight.contained = (storage_t<double>)0x0;
            AStack_818.connectability.has_value_ = false;
            AStack_818.bindMaterialAs.contained._16_8_ = 0;
            AStack_818.bindMaterialAs.contained._24_8_ = 0;
            AStack_818.bindMaterialAs.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.bindMaterialAs.contained._8_8_ = 0;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.comment.contained._8_8_ = 0;
            AStack_818.comment.contained._16_8_ = 0;
            AStack_818.comment.contained._24_8_ = 0;
            AStack_818.comment.contained._32_8_ = 0;
            AStack_818.comment.contained._40_8_ = 0;
            AStack_818.customData.has_value_ = false;
            AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
            ;
            AStack_818.customData.contained._8_8_ = 0;
            AStack_818.customData.contained._16_8_ = 0;
            AStack_818.customData.contained._24_8_ = 0;
            AStack_818.customData.contained._32_8_ = 0;
            AStack_818.customData.contained._40_8_ = 0;
            AStack_818.weight.has_value_ = false;
            AStack_818.connectability.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.connectability.contained._8_8_ = 0;
            AStack_818.connectability.contained._16_8_ = 0;
            AStack_818.connectability.contained._24_8_ = 0;
            AStack_818.outputName.has_value_ = false;
            AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
            ;
            AStack_818.outputName.contained._8_8_ = 0;
            AStack_818.outputName.contained._16_8_ = 0;
            AStack_818.outputName.contained._24_8_ = 0;
            AStack_818.renderType.has_value_ = false;
            AStack_818.sdrMetadata.has_value_ = false;
            AStack_818.renderType.contained._16_8_ = 0;
            AStack_818.renderType.contained._24_8_ = 0;
            AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
            ;
            AStack_818.renderType.contained._8_8_ = 0;
            AStack_818.displayName.has_value_ = false;
            AStack_818.sdrMetadata.contained._32_8_ = 0;
            AStack_818.sdrMetadata.contained._40_8_ = 0;
            AStack_818.sdrMetadata.contained._16_8_ = 0;
            AStack_818.sdrMetadata.contained._24_8_ = 0;
            AStack_818.sdrMetadata.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.sdrMetadata.contained._8_8_ = 0;
            AStack_818.displayGroup.has_value_ = false;
            AStack_818.displayName.contained._16_8_ = 0;
            AStack_818.displayName.contained._24_8_ = 0;
            AStack_818.displayName.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.displayName.contained._8_8_ = 0;
            AStack_818.bindMaterialAs.has_value_ = false;
            AStack_818.displayGroup.contained._16_8_ = 0;
            AStack_818.displayGroup.contained._24_8_ = 0;
            AStack_818.displayGroup.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.displayGroup.contained._8_8_ = 0;
            local_830[0x10] = 0;
            stack0xfffffffffffff7e1 = 0;
            local_830._0_8_ = (pointer)0x0;
            local_830[8] = 0;
            local_830._9_7_ = 0;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            AStack_818.stringData.
            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            AStack_818.stringData.
            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            AStack_818.stringData.
            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_898 = Uniform;
            local_608._8_6_ = 0x6e656b6f74;
            local_608._0_8_ = (anon_struct_8_0_00000001_for___align)0x5;
            local_8e8 = attr_name;
            local_890._M_p = (pointer)&local_880;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_610 = (undefined1  [8])(local_608 + 8);
            ::std::__cxx11::string::_M_assign((string *)&local_890);
            v = extraout_EDX;
            if (local_610 != (undefined1  [8])(local_608 + 8)) {
              operator_delete((void *)local_610,local_608._8_8_ + 1);
              v = extraout_EDX_00;
            }
            if ((pGVar12->elementType)._blocked == true) {
              local_858 = true;
            }
            if ((pGVar12->elementType)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (pGVar12->elementType)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_start) {
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &(pGVar12->elementType)._paths);
              v = extraout_EDX_01;
            }
            local_608._8_8_ = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_610 = (undefined1  [8])0x0;
            local_608._16_8_ = local_608._16_8_ & 0xffffffffffffff00;
            local_5f0._0_8_ = (pointer)0x0;
            local_5f0[8] = 0;
            local_5f0._9_7_ = 0;
            local_5f0[0x10] = 0;
            local_5f0._17_7_ = 0;
            aStack_5d8._M_local_buf[0] = '\0';
            tinyusdz::to_string_abi_cxx11_
                      ((string *)&local_978,
                       (tinyusdz *)
                       (ulong)(uint)(&(pGVar12->elementType)._attrib)
                                    [(pGVar12->elementType)._attrib.has_value_ ^ 1].contained,v);
            local_950._8_8_ = (char *)0x0;
            local_940._M_allocated_capacity = local_940._M_allocated_capacity & 0xffffffffffffff00;
            local_950._0_8_ = &local_940;
            ::std::__cxx11::string::_M_assign((string *)local_950);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_978.dynamic != &aStack_968) {
              operator_delete(local_978.dynamic,
                              CONCAT71(aStack_968._M_allocated_capacity._1_7_,
                                       aStack_968._M_local_buf[0]) + 1);
            }
            aStack_968._M_local_buf[0] = '`';
            aStack_968._M_allocated_capacity._1_7_ = 0x45c5;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)operator_new(0x20);
            paVar13->_M_allocated_capacity = (size_type)(paVar13->_M_local_buf + 0x10);
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)paVar13,local_950._0_8_,(char *)(local_950._8_8_ + local_950._0_8_)
                      );
            local_978.dynamic = paVar13;
            linb::any::operator=((any *)local_610,(any *)&local_978);
            if (CONCAT71(aStack_968._M_allocated_capacity._1_7_,aStack_968._M_local_buf[0]) != 0) {
              (**(code **)(CONCAT71(aStack_968._M_allocated_capacity._1_7_,
                                    aStack_968._M_local_buf[0]) + 0x20))(&local_978);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_950._0_8_ != &local_940) {
              operator_delete((void *)local_950._0_8_,local_940._M_allocated_capacity + 1);
            }
            Attribute::set_var((Attribute *)local_8b8,(PrimVar *)local_610);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_5f0);
            if ((undefined8 *)local_608._8_8_ != (undefined8 *)0x0) {
              (**(code **)(local_608._8_8_ + 0x20))(local_610);
            }
            AttrMetas::operator=(&AStack_818,&(pGVar12->elementType)._metas);
            Property::Property((Property *)local_610,(Attribute *)local_8b8,false);
            Property::operator=(out_prop,(Property *)local_610);
            Property::~Property((Property *)local_610);
            AttrMetas::~AttrMetas(&AStack_818);
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_850);
            if (local_860 != (vtable_type *)0x0) {
              (*local_860->destroy)(&local_870);
              local_860 = (vtable_type *)0x0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_890._M_p != &local_880) {
              operator_delete(local_890._M_p,
                              CONCAT71(local_880._M_allocated_capacity._1_7_,
                                       local_880._M_local_buf[0]) + 1);
            }
            attr_name = local_8e8;
            if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
              operator_delete((void *)local_8b8._0_8_,local_8b8._16_8_ + 1);
            }
          }
          iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
          if (iVar6 == 0) {
            local_8b8._0_8_ = local_8b8 + 0x10;
            local_8b8._8_8_ = (char *)0x0;
            local_8b8._16_8_ = local_8b8._16_8_ & 0xffffffffffffff00;
            local_894 = false;
            local_888 = 0;
            local_880._M_local_buf[0] = '\0';
            local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_870.dynamic = (void *)0x0;
            local_858 = false;
            local_850._0_8_ = (pointer)0x0;
            local_850[8] = 0;
            local_850._9_7_ = 0;
            local_850[0x10] = 0;
            local_850._17_8_ = 0;
            AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
            AStack_818.elementSize.has_value_ = false;
            AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
            AStack_818.hidden.has_value_ = false;
            AStack_818.hidden.contained = (storage_t<bool>)0x0;
            AStack_818.comment.has_value_ = false;
            AStack_818.weight.contained = (storage_t<double>)0x0;
            AStack_818.connectability.has_value_ = false;
            AStack_818.bindMaterialAs.contained._16_8_ = 0;
            AStack_818.bindMaterialAs.contained._24_8_ = 0;
            AStack_818.bindMaterialAs.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.bindMaterialAs.contained._8_8_ = 0;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.comment.contained._8_8_ = 0;
            AStack_818.comment.contained._16_8_ = 0;
            AStack_818.comment.contained._24_8_ = 0;
            AStack_818.comment.contained._32_8_ = 0;
            AStack_818.comment.contained._40_8_ = 0;
            AStack_818.customData.has_value_ = false;
            AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
            ;
            AStack_818.customData.contained._8_8_ = 0;
            AStack_818.customData.contained._16_8_ = 0;
            AStack_818.customData.contained._24_8_ = 0;
            AStack_818.customData.contained._32_8_ = 0;
            AStack_818.customData.contained._40_8_ = 0;
            AStack_818.weight.has_value_ = false;
            AStack_818.connectability.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.connectability.contained._8_8_ = 0;
            AStack_818.connectability.contained._16_8_ = 0;
            AStack_818.connectability.contained._24_8_ = 0;
            AStack_818.outputName.has_value_ = false;
            AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
            ;
            AStack_818.outputName.contained._8_8_ = 0;
            AStack_818.outputName.contained._16_8_ = 0;
            AStack_818.outputName.contained._24_8_ = 0;
            AStack_818.renderType.has_value_ = false;
            AStack_818.sdrMetadata.has_value_ = false;
            AStack_818.renderType.contained._16_8_ = 0;
            AStack_818.renderType.contained._24_8_ = 0;
            AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
            ;
            AStack_818.renderType.contained._8_8_ = 0;
            AStack_818.displayName.has_value_ = false;
            AStack_818.sdrMetadata.contained._32_8_ = 0;
            AStack_818.sdrMetadata.contained._40_8_ = 0;
            AStack_818.sdrMetadata.contained._16_8_ = 0;
            AStack_818.sdrMetadata.contained._24_8_ = 0;
            AStack_818.sdrMetadata.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.sdrMetadata.contained._8_8_ = 0;
            AStack_818.displayGroup.has_value_ = false;
            AStack_818.displayName.contained._16_8_ = 0;
            AStack_818.displayName.contained._24_8_ = 0;
            AStack_818.displayName.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.displayName.contained._8_8_ = 0;
            AStack_818.bindMaterialAs.has_value_ = false;
            AStack_818.displayGroup.contained._16_8_ = 0;
            AStack_818.displayGroup.contained._24_8_ = 0;
            AStack_818.displayGroup.contained.data.__align =
                 (anon_struct_8_0_00000001_for___align)0x0;
            AStack_818.displayGroup.contained._8_8_ = 0;
            local_830[0x10] = 0;
            stack0xfffffffffffff7e1 = 0;
            local_830._0_8_ = (pointer)0x0;
            local_830[8] = 0;
            local_830._9_7_ = 0;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            AStack_818.stringData.
            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            AStack_818.stringData.
            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            AStack_818.stringData.
            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_898 = Uniform;
            local_608._8_6_ = 0x6e656b6f74;
            local_608._0_8_ = (anon_struct_8_0_00000001_for___align)0x5;
            local_8e8 = attr_name;
            local_890._M_p = (pointer)&local_880;
            AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_610 = (undefined1  [8])(local_608 + 8);
            ::std::__cxx11::string::_M_assign((string *)&local_890);
            if (local_610 != (undefined1  [8])(local_608 + 8)) {
              operator_delete((void *)local_610,local_608._8_8_ + 1);
            }
            if ((pGVar12->familyName)._blocked == true) {
              local_858 = true;
            }
            if ((pGVar12->familyName)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (pGVar12->familyName)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_start) {
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &(pGVar12->familyName)._paths);
            }
            if ((pGVar12->familyName)._attrib.has_value_ == true) {
              local_950[0] = 1;
              local_950._8_8_ = local_940._M_local_buf + 8;
              lVar17 = *(long *)&(pGVar12->familyName)._attrib.contained;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_950 + 8),lVar17,
                         *(long *)((long)&(pGVar12->familyName)._attrib.contained + 8) + lVar17);
              local_8e0 = (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                          CONCAT71(local_8e0._1_7_,local_950[0]);
              if ((allocator)local_950[0] == (allocator)0x1) {
                aStack_968._M_local_buf[0] = '`';
                aStack_968._M_allocated_capacity._1_7_ = 0x45c5;
                paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)operator_new(0x20);
                paVar13->_M_allocated_capacity = (size_type)(paVar13->_M_local_buf + 0x10);
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)paVar13,local_950._8_8_,
                           (char *)(local_940._M_allocated_capacity + local_950._8_8_));
                local_608._8_8_ = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
                local_610 = (undefined1  [8])0x0;
                local_608._16_8_ = local_608._16_8_ & 0xffffffffffffff00;
                local_5f0._0_8_ = (pointer)0x0;
                local_5f0[8] = 0;
                local_5f0._9_7_ = 0;
                local_5f0[0x10] = 0;
                local_5f0._17_7_ = 0;
                aStack_5d8._M_local_buf[0] = '\0';
                local_978.dynamic = paVar13;
                linb::any::operator=((any *)local_610,(any *)&local_978);
                Attribute::set_var((Attribute *)local_8b8,(PrimVar *)local_610);
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)local_5f0);
                if ((undefined8 *)local_608._8_8_ != (undefined8 *)0x0) {
                  (**(code **)(local_608._8_8_ + 0x20))(local_610);
                }
                if (CONCAT71(aStack_968._M_allocated_capacity._1_7_,aStack_968._M_local_buf[0]) != 0
                   ) {
                  (**(code **)(CONCAT71(aStack_968._M_allocated_capacity._1_7_,
                                        aStack_968._M_local_buf[0]) + 0x20))(&local_978);
                }
              }
              else {
                local_978.dynamic = &aStack_968;
                local_610 = (undefined1  [8])0x31;
                local_978.dynamic =
                     (void *)::std::__cxx11::string::_M_create
                                       ((ulong *)&local_978.dynamic,(ulong)local_610);
                aStack_968._M_local_buf[0] = local_610[0];
                aStack_968._M_allocated_capacity._1_7_ = local_610._1_7_;
                *(undefined8 *)local_978.dynamic = 0x616e7265746e495b;
                *(undefined8 *)((long)local_978.dynamic + 8) = 0x205d726f7272456c;
                *(undefined8 *)((long)local_978.dynamic + 0x10) = 0x2064696c61766e49;
                *(undefined8 *)((long)local_978.dynamic + 0x18) = 0x7474416465707954;
                *(undefined8 *)((long)local_978.dynamic + 0x20) = 0x7b3c657475626972;
                *(undefined8 *)((long)local_978.dynamic + 0x28) = 0x65756c6176203e7d;
                *(string *)((long)local_978.dynamic + 0x30) = (string)0x2e;
                *(string *)((long)local_978.dynamic + (long)local_610) = (string)0x0;
                local_910._16_4_ = 0x656b6f74;
                local_910[0x14] = 'n';
                local_910[0x15] = '\0';
                local_910._8_8_ = 5;
                local_978._8_1_ = aStack_968._M_local_buf[0];
                local_978._9_7_ = aStack_968._M_allocated_capacity._1_7_;
                local_910._0_8_ =
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_910 + 0x10)
                ;
                fmt::format<std::__cxx11::string>
                          ((string *)local_610,(fmt *)&local_978,(string *)local_910,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_610);
                ::std::__cxx11::string::_M_append((char *)&local_8d8,(ulong)local_610);
                if (local_610 != (undefined1  [8])(local_608 + 8)) {
                  operator_delete((void *)local_610,local_608._8_8_ + 1);
                }
                if ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_910._0_8_ !=
                    (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_910 + 0x10))
                {
                  operator_delete((void *)local_910._0_8_,
                                  CONCAT17(local_910[0x17],
                                           CONCAT16(local_910[0x16],
                                                    CONCAT15(local_910[0x15],
                                                             CONCAT14(local_910[0x14],
                                                                      local_910._16_4_)))) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_978.dynamic != &aStack_968) {
                  operator_delete(local_978.dynamic,
                                  CONCAT71(aStack_968._M_allocated_capacity._1_7_,
                                           aStack_968._M_local_buf[0]) + 1);
                }
              }
              if (((allocator)local_950[0] == (allocator)0x1) &&
                 ((char *)local_950._8_8_ != local_940._M_local_buf + 8)) {
                operator_delete((void *)local_950._8_8_,
                                CONCAT71(local_940._9_7_,local_940._M_local_buf[8]) + 1);
              }
              if ((char)local_8e0 != '\0') goto LAB_00316698;
              bVar4 = false;
            }
            else {
LAB_00316698:
              AttrMetas::operator=(&AStack_818,&(pGVar12->familyName)._metas);
              Property::Property((Property *)local_610,(Attribute *)local_8b8,false);
              Property::operator=(out_prop,(Property *)local_610);
              Property::~Property((Property *)local_610);
              bVar4 = true;
            }
            AttrMetas::~AttrMetas(&AStack_818);
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_850);
            if (local_860 != (vtable_type *)0x0) {
              (*local_860->destroy)(&local_870);
              local_860 = (vtable_type *)0x0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_890._M_p != &local_880) {
              operator_delete(local_890._M_p,
                              CONCAT71(local_880._M_allocated_capacity._1_7_,
                                       local_880._M_local_buf[0]) + 1);
            }
            attr_name = local_8e8;
            if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
              operator_delete((void *)local_8b8._0_8_,local_8b8._16_8_ + 1);
            }
            if (bVar4) goto LAB_00316782;
            local_978.dynamic = &aStack_968;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_978,"Convert Property {} failed: {}\n","");
            fmt::format<char[11],std::__cxx11::string>
                      ((string *)local_950,(fmt *)&local_978,(string *)"familyName",
                       (char (*) [11])&local_8d8,in_R8);
            attr_name = local_8e8;
            prim = local_8f0;
            local_8b8._16_8_ = local_940._M_allocated_capacity;
            local_8b8._8_8_ = local_950._8_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_950._0_8_ == &local_940) {
              local_608._16_8_ = CONCAT71(local_940._9_7_,local_940._M_local_buf[8]);
              local_950._0_8_ = local_608 + 8;
            }
            local_610 = (undefined1  [8])(local_608 + 8);
            local_950._8_8_ = (char *)0x0;
            local_940._M_allocated_capacity = local_940._M_allocated_capacity & 0xffffffffffffff00;
            local_898 = local_898 & 0xffffff00;
            local_8b8._0_8_ = local_950._0_8_;
            if ((undefined1  [8])local_950._0_8_ == local_610) {
              local_8b8._24_8_ = local_608._16_8_;
              local_8b8._0_8_ = local_8b8 + 0x10;
            }
            local_608._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_608._8_8_ = local_8b8._16_8_ & 0xffffffffffffff00;
            local_950._0_8_ = &local_940;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_978.dynamic != &aStack_968) {
              operator_delete(local_978.dynamic,
                              CONCAT71(aStack_968._M_allocated_capacity._1_7_,
                                       aStack_968._M_local_buf[0]) + 1);
            }
          }
          else {
LAB_00316782:
            iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
            if (iVar6 == 0) {
              if ((pGVar12->super_MaterialBinding).materialBinding.has_value_ == true) {
                Property::Property((Property *)local_610,
                                   (Relationship *)
                                   &(pGVar12->super_MaterialBinding).materialBinding.contained,false
                                  );
                Property::operator=(out_prop,(Property *)local_610);
                Property::~Property((Property *)local_610);
                goto LAB_00316922;
              }
              local_898 = CONCAT31(local_898._1_3_,1);
              local_8b8._0_8_ = local_8b8._0_8_ & 0xffffffffffffff00;
              prim = local_8f0;
            }
            else {
              cVar8 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                              *)&pGVar12->props,attr_name);
              if ((_Rb_tree_header *)cVar8._M_node ==
                  &(pGVar12->props)._M_t._M_impl.super__Rb_tree_header) {
                local_8b8._0_8_ = local_8b8._0_8_ & 0xffffffffffffff00;
              }
              else {
                ::std::__cxx11::string::_M_assign((string *)out_prop);
                (out_prop->_attrib)._varying_authored = (bool)cVar8._M_node[3].field_0x4;
                (out_prop->_attrib)._variability = cVar8._M_node[3]._M_color;
                ::std::__cxx11::string::_M_assign((string *)&(out_prop->_attrib)._type_name);
                linb::any::operator=
                          ((any *)&(out_prop->_attrib)._var,(any *)&cVar8._M_node[4]._M_parent);
                (out_prop->_attrib)._var._blocked = SUB41(cVar8._M_node[5]._M_color,0);
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::operator=(&(out_prop->_attrib)._var._ts._samples,
                            (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&cVar8._M_node[5]._M_parent);
                (out_prop->_attrib)._var._ts._dirty = SUB41(cVar8._M_node[6]._M_color,0);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &(out_prop->_attrib)._paths,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &cVar8._M_node[6]._M_parent);
                AttrMetas::operator=(&(out_prop->_attrib)._metas,(AttrMetas *)(cVar8._M_node + 7));
                *(_Base_ptr *)&out_prop->_listOpQual = cVar8._M_node[0x17]._M_parent;
                (out_prop->_rel).type = *(Type *)&cVar8._M_node[0x17]._M_left;
                Path::operator=(&(out_prop->_rel).targetPath,(Path *)&cVar8._M_node[0x17]._M_right);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &(out_prop->_rel).targetPathVector,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &cVar8._M_node[0x1e]._M_parent);
                (out_prop->_rel).listOpQual = cVar8._M_node[0x1f]._M_color;
                AttrMetas::operator=
                          (&(out_prop->_rel)._metas,(AttrMetas *)&cVar8._M_node[0x1f]._M_parent);
                (out_prop->_rel)._varying_authored = *(bool *)&cVar8._M_node[0x2f]._M_left;
                ::std::__cxx11::string::_M_assign((string *)&out_prop->_prop_value_type_name);
                out_prop->_has_custom = *(bool *)&cVar8._M_node[0x30]._M_right;
LAB_00316922:
                local_8b8[0] = 1;
              }
              local_898 = CONCAT31(local_898._1_3_,1);
              prim = local_8f0;
            }
          }
          if ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
              local_8d8.dynamic !=
              (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
              local_8c8) {
            operator_delete(local_8d8.dynamic,(ulong)((long)(float *)local_8c8._0_8_ + 1));
          }
        }
        if ((bool)(undefined1)local_898 != true) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_610,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                     ,0x5c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_610,"GetProperty",0xb);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
          iVar6 = 0x793;
          goto LAB_00314ba2;
        }
        bVar4 = true;
        if ((value_type_conflict)local_8b8[0] != false) goto LAB_00314c60;
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_610,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb)
        ;
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x793);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_978.dynamic = &aStack_968;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_978,"Attribute `{}` does not exist in Prim {}({})","");
        local_910._16_4_ = 0x6d6f6547;
        local_910[0x14] = 'S';
        local_910[0x15] = 'u';
        local_910[0x16] = 'b';
        local_910[0x17] = 's';
        local_910[0x18] = 'e';
        local_910[0x19] = 't';
        local_910._8_8_ = 10;
        local_910[0x1a] = '\0';
        goto LAB_00316a91;
      }
      pvVar1 = (prim->_data).v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) goto LAB_003176f0;
      uVar5 = (*pvVar1->type_id)();
      if (uVar5 != 0x801) {
        pvVar1 = (prim->_data).v_.vtable;
        if (pvVar1 == (vtable_type *)0x0) goto LAB_003176f0;
        uVar5 = (*pvVar1->type_id)();
        if (uVar5 == 0x802) {
          material = tinyusdz::value::Value::as<tinyusdz::Material>(&prim->_data,false);
          anon_unknown_6::GetPrimProperty<tinyusdz::Material>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_8b8,material,attr_name,out_prop);
          if ((bool)(undefined1)local_898 != true) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_610,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                       ,0x5c);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_610,"GetProperty",0xb);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x795);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            if ((bool)(undefined1)local_898 == true) goto LAB_00317bb8;
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_610,(char *)local_8b8._0_8_,local_8b8._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            goto LAB_00313f83;
          }
          bVar4 = true;
          if ((value_type_conflict)local_8b8[0] != false) goto LAB_00314c60;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_610,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                     ,0x5c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_610,"GetProperty",0xb);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
          poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x795);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          local_978.dynamic = &aStack_968;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_978,"Attribute `{}` does not exist in Prim {}({})","");
          uVar14 = 0x6c6169726574614d;
LAB_0031648d:
          local_910._16_4_ = (undefined4)uVar14;
          local_910[0x14] = (undefined1)((ulong)uVar14 >> 0x20);
          local_910[0x15] = (undefined1)((ulong)uVar14 >> 0x28);
          local_910[0x16] = (undefined1)((ulong)uVar14 >> 0x30);
          local_910[0x17] = (undefined1)((ulong)uVar14 >> 0x38);
          local_910._8_8_ = 8;
          local_910[0x18] = '\0';
LAB_003164b1:
          local_910._0_8_ =
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_910 + 0x10);
          fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_950,(fmt *)&local_978,attr_name,
                     &(prim->_elementPath)._prim_part,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_910,
                     in_R9);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_610,(char *)local_950._0_8_,local_950._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_950._0_8_ != &local_940) {
            operator_delete((void *)local_950._0_8_,local_940._M_allocated_capacity + 1);
          }
          if ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_910._0_8_ !=
              (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_910 + 0x10)) {
            operator_delete((void *)local_910._0_8_,
                            CONCAT17(local_910[0x17],
                                     CONCAT16(local_910[0x16],
                                              CONCAT15(local_910[0x15],
                                                       CONCAT14(local_910[0x14],local_910._16_4_))))
                            + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_978.dynamic != &aStack_968) {
            operator_delete(local_978.dynamic,
                            CONCAT71(aStack_968._M_allocated_capacity._1_7_,
                                     aStack_968._M_local_buf[0]) + 1);
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            goto LAB_00313e94;
          }
        }
        else {
          pvVar1 = (prim->_data).v_.vtable;
          if (pvVar1 == (vtable_type *)0x0) goto LAB_003176f0;
          uVar5 = (*pvVar1->type_id)();
          if (uVar5 == 0x2001) {
            skelroot = tinyusdz::value::Value::as<tinyusdz::SkelRoot>(&prim->_data,false);
            anon_unknown_6::GetPrimProperty<tinyusdz::SkelRoot>
                      ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_8b8,skelroot,attr_name,out_prop);
            if ((bool)(undefined1)local_898 == true) {
              bVar4 = true;
              if ((value_type_conflict)local_8b8[0] != false) goto LAB_00314c60;
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                         ,0x5c);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,"GetProperty",0xb);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x796);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_978.dynamic = &aStack_968;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_978,"Attribute `{}` does not exist in Prim {}({})","");
              uVar14 = 0x746f6f526c656b53;
              goto LAB_0031648d;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_610,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                       ,0x5c);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_610,"GetProperty",0xb);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
            iVar6 = 0x796;
          }
          else {
            pvVar1 = (prim->_data).v_.vtable;
            if (pvVar1 == (vtable_type *)0x0) goto LAB_003176f0;
            uVar5 = (*pvVar1->type_id)();
            if (uVar5 == 0x2004) {
              blendshape = tinyusdz::value::Value::as<tinyusdz::BlendShape>(&prim->_data,false);
              anon_unknown_6::GetPrimProperty<tinyusdz::BlendShape>
                        ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_8b8,blendshape,attr_name,out_prop);
              if ((bool)(undefined1)local_898 == true) {
                bVar4 = true;
                if ((value_type_conflict)local_8b8[0] != false) goto LAB_00314c60;
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                           ,0x5c);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,"GetProperty",0xb);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
                poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x797);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                local_978.dynamic = &aStack_968;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_978,"Attribute `{}` does not exist in Prim {}({})","");
                local_910._16_4_ = 0x6e656c42;
                local_910[0x14] = 'd';
                local_910[0x15] = 'S';
                local_910[0x16] = 'h';
                local_910[0x17] = 'a';
                local_910[0x18] = 'p';
                local_910[0x19] = 'e';
                local_910._8_8_ = 10;
                local_910[0x1a] = '\0';
                goto LAB_003164b1;
              }
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                         ,0x5c);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,"GetProperty",0xb);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
              iVar6 = 0x797;
            }
            else {
              pvVar1 = (prim->_data).v_.vtable;
              if (pvVar1 == (vtable_type *)0x0) goto LAB_003176f0;
              uVar5 = (*pvVar1->type_id)();
              if (uVar5 == 0x2002) {
                skel = tinyusdz::value::Value::as<tinyusdz::Skeleton>(&prim->_data,false);
                anon_unknown_6::GetPrimProperty<tinyusdz::Skeleton>
                          ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_8b8,skel,attr_name,out_prop);
                if ((bool)(undefined1)local_898 == true) {
                  bVar4 = true;
                  if ((value_type_conflict)local_8b8[0] != false) goto LAB_00314c60;
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_610,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_610,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                             ,0x5c);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_610,"GetProperty",0xb);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3)
                  ;
                  poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x798);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                  local_978.dynamic = &aStack_968;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_978,"Attribute `{}` does not exist in Prim {}({})","")
                  ;
                  local_910._16_4_ = 0x6c656b53;
                  local_910[0x14] = 'e';
                  local_910[0x15] = 't';
                  local_910[0x16] = 'o';
                  local_910[0x17] = 'n';
                  local_910._8_8_ = 8;
                  local_910[0x18] = '\0';
                  goto LAB_003164b1;
                }
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                           ,0x5c);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,"GetProperty",0xb);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
                iVar6 = 0x798;
              }
              else {
                pvVar1 = (prim->_data).v_.vtable;
                if ((pvVar1 == (vtable_type *)0x0) ||
                   (uVar5 = (*pvVar1->type_id)(), uVar5 != 0x2003)) goto LAB_003176f0;
                anim = tinyusdz::value::Value::as<tinyusdz::SkelAnimation>(&prim->_data,false);
                anon_unknown_6::GetPrimProperty<tinyusdz::SkelAnimation>
                          ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_8b8,anim,attr_name,out_prop);
                if ((bool)(undefined1)local_898 == true) {
                  bVar4 = true;
                  if ((value_type_conflict)local_8b8[0] != false) goto LAB_00314c60;
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_610,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_610,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                             ,0x5c);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_610,"GetProperty",0xb);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3)
                  ;
                  poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x799);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                  local_978.dynamic = &aStack_968;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_978,"Attribute `{}` does not exist in Prim {}({})","")
                  ;
                  local_910._16_4_ = 0x6c656b53;
                  local_910[0x14] = 'A';
                  local_910[0x15] = 'n';
                  local_910[0x16] = 'i';
                  local_910[0x17] = 'm';
                  local_910[0x18] = 'a';
                  local_910[0x19] = 't';
                  local_910[0x1a] = 'i';
                  local_910._27_2_ = 0x6e6f;
                  local_910._8_8_ = 0xd;
                  local_910[0x1d] = '\0';
                  goto LAB_003164b1;
                }
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                           ,0x5c);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,"GetProperty",0xb);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
                iVar6 = 0x799;
              }
            }
          }
          poVar10 = (ostream *)::std::ostream::operator<<(local_610,iVar6);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          if ((bool)(undefined1)local_898 == true) goto LAB_00317bb8;
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_610,(char *)local_8b8._0_8_,local_8b8._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            goto LAB_00314c1e;
          }
        }
        goto LAB_00314c3d;
      }
      shader = tinyusdz::value::Value::as<tinyusdz::Shader>(&prim->_data,false);
      anon_unknown_6::GetPrimProperty<tinyusdz::Shader>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_8b8,shader,attr_name,out_prop);
      if ((bool)(undefined1)local_898 != true) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_610,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb)
        ;
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
        iVar6 = 0x794;
        goto LAB_00313f26;
      }
      bVar4 = true;
      if ((value_type_conflict)local_8b8[0] != false) goto LAB_00314c60;
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_610,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x794);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_978.dynamic = &aStack_968;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_978,"Attribute `{}` does not exist in Prim {}({})","");
      local_910._16_4_ = 0x64616853;
      local_910[0x14] = 'e';
      local_910[0x15] = 'r';
      local_910._8_8_ = 6;
      local_910[0x16] = '\0';
      goto LAB_00313de1;
    }
    this = (Xformable *)tinyusdz::value::Value::as<tinyusdz::Xform>(&prim->_data,false);
    if (out_prop == (Property *)0x0) {
      local_898 = local_898 & 0xffffff00;
      local_8e8 = attr_name;
      ::std::__cxx11::string::string
                ((string *)local_610,"[InternalError] nullptr in output Property is not allowed.",
                 (allocator *)local_950);
      if (local_610 == (undefined1  [8])(local_608 + 8)) {
        local_8b8._24_8_ = local_608._16_8_;
        local_8b8._0_8_ = local_8b8 + 0x10;
      }
      else {
        local_8b8._0_8_ = local_610;
      }
      local_8b8._16_8_ = local_608._8_8_;
      local_8b8._8_8_ = local_608._0_8_;
    }
    else {
      local_8f0 = prim;
      local_8e8 = attr_name;
      iVar6 = ::std::__cxx11::string::compare((char *)attr_name);
      if (iVar6 == 0) {
        Xformable::xformOpOrder
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_978,this);
        local_910._16_4_ = 0x45c7a8;
        local_910[0x14] = '\0';
        local_910[0x15] = '\0';
        local_910[0x16] = '\0';
        local_910[0x17] = '\0';
        this_00 = (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)operator_new(0x18);
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                  (this_00,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_978);
        local_940._M_allocated_capacity =
             (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_950._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_940._M_local_buf[8] = '\0';
        local_930._0_8_ = (pointer)0x0;
        local_930[8] = 0;
        local_930._9_7_ = 0;
        local_930[0x10] = 0;
        stack0xfffffffffffff6e1 = 0;
        local_910._0_8_ = this_00;
        linb::any::operator=
                  ((any *)local_950,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_978);
        local_8b8._0_8_ = local_8b8 + 0x10;
        local_8b8._8_8_ = (char *)0x0;
        local_8b8._16_8_ = local_8b8._16_8_ & 0xffffffffffffff00;
        local_898 = Varying;
        local_894 = false;
        local_890._M_p = (pointer)&local_880;
        local_888 = 0;
        local_880._M_local_buf[0] = '\0';
        local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_870.dynamic = (void *)0x0;
        local_858 = false;
        local_850._0_8_ = (pointer)0x0;
        local_850[8] = 0;
        local_850._9_7_ = 0;
        local_850[0x10] = 0;
        local_850._17_8_ = 0;
        local_8e0 = (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830;
        AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
        AStack_818.elementSize.has_value_ = false;
        AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
        AStack_818.hidden.has_value_ = false;
        AStack_818.hidden.contained = (storage_t<bool>)0x0;
        AStack_818.comment.has_value_ = false;
        AStack_818.weight.contained = (storage_t<double>)0x0;
        AStack_818.connectability.has_value_ = false;
        AStack_818.bindMaterialAs.contained._16_8_ = 0;
        AStack_818.bindMaterialAs.contained._24_8_ = 0;
        AStack_818.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
        ;
        AStack_818.bindMaterialAs.contained._8_8_ = 0;
        AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
        AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.comment.contained._8_8_ = 0;
        AStack_818.comment.contained._16_8_ = 0;
        AStack_818.comment.contained._24_8_ = 0;
        AStack_818.comment.contained._32_8_ = 0;
        AStack_818.comment.contained._40_8_ = 0;
        AStack_818.customData.has_value_ = false;
        AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.customData.contained._8_8_ = 0;
        AStack_818.customData.contained._16_8_ = 0;
        AStack_818.customData.contained._24_8_ = 0;
        AStack_818.customData.contained._32_8_ = 0;
        AStack_818.customData.contained._40_8_ = 0;
        AStack_818.weight.has_value_ = false;
        AStack_818.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
        ;
        AStack_818.connectability.contained._8_8_ = 0;
        AStack_818.connectability.contained._16_8_ = 0;
        AStack_818.connectability.contained._24_8_ = 0;
        AStack_818.outputName.has_value_ = false;
        AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.outputName.contained._8_8_ = 0;
        AStack_818.outputName.contained._16_8_ = 0;
        AStack_818.outputName.contained._24_8_ = 0;
        AStack_818.renderType.has_value_ = false;
        AStack_818.sdrMetadata.has_value_ = false;
        AStack_818.renderType.contained._16_8_ = 0;
        AStack_818.renderType.contained._24_8_ = 0;
        AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.renderType.contained._8_8_ = 0;
        AStack_818.displayName.has_value_ = false;
        AStack_818.sdrMetadata.contained._32_8_ = 0;
        AStack_818.sdrMetadata.contained._40_8_ = 0;
        AStack_818.sdrMetadata.contained._16_8_ = 0;
        AStack_818.sdrMetadata.contained._24_8_ = 0;
        AStack_818.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.sdrMetadata.contained._8_8_ = 0;
        AStack_818.displayGroup.has_value_ = false;
        AStack_818.displayName.contained._16_8_ = 0;
        AStack_818.displayName.contained._24_8_ = 0;
        AStack_818.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.displayName.contained._8_8_ = 0;
        AStack_818.bindMaterialAs.has_value_ = false;
        AStack_818.displayGroup.contained._16_8_ = 0;
        AStack_818.displayGroup.contained._24_8_ = 0;
        AStack_818.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.displayGroup.contained._8_8_ = 0;
        local_830[0x10] = 0;
        stack0xfffffffffffff7e1 = 0;
        local_830._0_8_ = (pointer)0x0;
        local_830[8] = 0;
        local_830._9_7_ = 0;
        AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        AStack_818.stringData.
        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        AStack_818.stringData.
        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        AStack_818.stringData.
        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        Attribute::set_var((Attribute *)local_8b8,(PrimVar *)local_950);
        local_898 = Uniform;
        Property::Property((Property *)local_610);
        Property::set_attribute((Property *)local_610,(Attribute *)local_8b8);
        ::std::__cxx11::string::_M_assign((string *)out_prop);
        (out_prop->_attrib)._varying_authored = (bool)local_5f0[4];
        (out_prop->_attrib)._variability = local_5f0._0_4_;
        ::std::__cxx11::string::_M_assign((string *)&(out_prop->_attrib)._type_name);
        linb::any::operator=((any *)&(out_prop->_attrib)._var,&local_5c8);
        (out_prop->_attrib)._var._blocked = local_5b0;
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::operator=(&(out_prop->_attrib)._var._ts._samples,
                    (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)local_5a8);
        (out_prop->_attrib)._var._ts._dirty = local_590;
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &(out_prop->_attrib)._paths,&vStack_588);
        AttrMetas::operator=(&(out_prop->_attrib)._metas,&local_570);
        out_prop->_listOpQual = local_368;
        out_prop->_type = TStack_364;
        (out_prop->_rel).type = local_360;
        Path::operator=(&(out_prop->_rel).targetPath,&PStack_358);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &(out_prop->_rel).targetPathVector,&vStack_288);
        (out_prop->_rel).listOpQual = local_270;
        AttrMetas::operator=(&(out_prop->_rel)._metas,&AStack_268);
        (out_prop->_rel)._varying_authored = local_60;
        ::std::__cxx11::string::_M_assign((string *)&out_prop->_prop_value_type_name);
        out_prop->_has_custom = local_38;
        Property::~Property((Property *)local_610);
        AttrMetas::~AttrMetas(&AStack_818);
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(local_8e0);
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)local_850);
        if (local_860 != (vtable_type *)0x0) {
          (*local_860->destroy)(&local_870);
          local_860 = (vtable_type *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_p != &local_880) {
          operator_delete(local_890._M_p,
                          CONCAT71(local_880._M_allocated_capacity._1_7_,local_880._M_local_buf[0])
                          + 1);
        }
        prim = local_8f0;
        if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
          operator_delete((void *)local_8b8._0_8_,local_8b8._16_8_ + 1);
        }
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)local_930);
        if ((undefined8 *)local_940._M_allocated_capacity != (undefined8 *)0x0) {
          (**(code **)(local_940._M_allocated_capacity + 0x20))((storage_union *)local_950);
        }
        lVar17 = CONCAT17(local_910[0x17],
                          CONCAT16(local_910[0x16],
                                   CONCAT15(local_910[0x15],
                                            CONCAT14(local_910[0x14],local_910._16_4_))));
        if (lVar17 != 0) {
          (**(code **)(lVar17 + 0x20))(local_910);
        }
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_978);
      }
      else {
        this_01 = (this->xformOps).
                  super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pXVar2 = (this->xformOps).
                 super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (this_01 != pXVar2) {
          op = extraout_RDX;
          do {
            tinyusdz::to_string_abi_cxx11_((string *)&local_978,(tinyusdz *)this_01,op);
            if ((this_01->suffix)._M_string_length != 0) {
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_610,":",&this_01->suffix);
              ::std::__cxx11::string::_M_append((char *)&local_978,(ulong)local_610);
              if (local_610 != (undefined1  [8])(local_608 + 8)) {
                operator_delete((void *)local_610,local_608._8_8_ + 1);
              }
            }
            uVar14 = local_978.dynamic;
            op = (OpType *)CONCAT71(local_978._9_7_,local_978._8_1_);
            if ((op == (OpType *)local_8e8->_M_string_length) &&
               ((op == (OpType *)0x0 ||
                (iVar6 = bcmp(local_978.dynamic,(local_8e8->_M_dataplus)._M_p,(size_t)op),
                op = extraout_RDX_00, iVar6 == 0)))) {
              local_940._M_allocated_capacity =
                   (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
              uVar3 = 0;
              local_950._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_940._M_local_buf[8] = '\0';
              local_930._0_8_ = (pointer)0x0;
              local_930[8] = 0;
              local_930._9_7_ = 0;
              local_930[0x10] = 0;
              stack0xfffffffffffff6e1 = 0;
              local_8b8._0_8_ = local_8b8 + 0x10;
              local_8b8._8_8_ = (char *)0x0;
              local_8b8._16_8_ = local_8b8._16_8_ & 0xffffffffffffff00;
              local_898 = Varying;
              local_894 = false;
              local_890._M_p = (pointer)&local_880;
              local_888 = 0;
              local_880._M_local_buf[0] = '\0';
              local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
              local_870.dynamic = (void *)0x0;
              local_858 = false;
              local_850._0_8_ = (pointer)0x0;
              local_850[8] = 0;
              local_850._9_7_ = 0;
              local_850[0x10] = 0;
              local_850._17_8_ = 0;
              AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
              AStack_818.elementSize.has_value_ = false;
              AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
              AStack_818.hidden.has_value_ = false;
              AStack_818.hidden.contained = (storage_t<bool>)0x0;
              AStack_818.comment.has_value_ = false;
              AStack_818.weight.contained = (storage_t<double>)0x0;
              AStack_818.connectability.has_value_ = false;
              AStack_818.bindMaterialAs.contained._16_8_ = 0;
              AStack_818.bindMaterialAs.contained._24_8_ = 0;
              AStack_818.bindMaterialAs.contained.data.__align =
                   (anon_struct_8_0_00000001_for___align)0x0;
              AStack_818.bindMaterialAs.contained._8_8_ = 0;
              AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
              AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              AStack_818.comment.contained._8_8_ = 0;
              AStack_818.comment.contained._16_8_ = 0;
              AStack_818.comment.contained._24_8_ = 0;
              AStack_818.comment.contained._32_8_ = 0;
              AStack_818.comment.contained._40_8_ = 0;
              AStack_818.customData.has_value_ = false;
              AStack_818.customData.contained.data.__align =
                   (anon_struct_8_0_00000001_for___align)0x0;
              AStack_818.customData.contained._8_8_ = 0;
              AStack_818.customData.contained._16_8_ = 0;
              AStack_818.customData.contained._24_8_ = 0;
              AStack_818.customData.contained._32_8_ = 0;
              AStack_818.customData.contained._40_8_ = 0;
              AStack_818.weight.has_value_ = false;
              AStack_818.connectability.contained.data.__align =
                   (anon_struct_8_0_00000001_for___align)0x0;
              AStack_818.connectability.contained._8_8_ = 0;
              AStack_818.connectability.contained._16_8_ = 0;
              AStack_818.connectability.contained._24_8_ = 0;
              AStack_818.outputName.has_value_ = false;
              AStack_818.outputName.contained.data.__align =
                   (anon_struct_8_0_00000001_for___align)0x0;
              AStack_818.outputName.contained._8_8_ = 0;
              AStack_818.outputName.contained._16_8_ = 0;
              AStack_818.outputName.contained._24_8_ = 0;
              AStack_818.renderType.has_value_ = false;
              AStack_818.sdrMetadata.has_value_ = false;
              AStack_818.renderType.contained._16_8_ = 0;
              AStack_818.renderType.contained._24_8_ = 0;
              AStack_818.renderType.contained.data.__align =
                   (anon_struct_8_0_00000001_for___align)0x0;
              AStack_818.renderType.contained._8_8_ = 0;
              AStack_818.displayName.has_value_ = false;
              AStack_818.sdrMetadata.contained._32_8_ = 0;
              AStack_818.sdrMetadata.contained._40_8_ = 0;
              AStack_818.sdrMetadata.contained._16_8_ = 0;
              AStack_818.sdrMetadata.contained._24_8_ = 0;
              AStack_818.sdrMetadata.contained.data.__align =
                   (anon_struct_8_0_00000001_for___align)0x0;
              AStack_818.sdrMetadata.contained._8_8_ = 0;
              AStack_818.displayGroup.has_value_ = false;
              AStack_818.displayName.contained._16_8_ = 0;
              AStack_818.displayName.contained._24_8_ = 0;
              AStack_818.displayName.contained.data.__align =
                   (anon_struct_8_0_00000001_for___align)0x0;
              AStack_818.displayName.contained._8_8_ = 0;
              AStack_818.bindMaterialAs.has_value_ = false;
              AStack_818.displayGroup.contained._16_8_ = 0;
              AStack_818.displayGroup.contained._24_8_ = 0;
              AStack_818.displayGroup.contained.data.__align =
                   (anon_struct_8_0_00000001_for___align)0x0;
              AStack_818.displayGroup.contained._8_8_ = 0;
              local_830[0x10] = 0;
              stack0xfffffffffffff7e1 = 0;
              local_830._0_8_ = (pointer)0x0;
              local_830[8] = 0;
              local_830._9_7_ = 0;
              AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              AStack_818.stringData.
              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              AStack_818.stringData.
              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              AStack_818.stringData.
              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              if (this_01->op_type < ResetXformStack) {
                linb::any::operator=((any *)local_950,(any *)&this_01->_var);
                local_940._M_local_buf[8] = (this_01->_var)._blocked;
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)local_930,&(this_01->_var)._ts._samples);
                local_918 = (this_01->_var)._ts._dirty;
LAB_003147c1:
                prim = local_8f0;
                Attribute::set_var((Attribute *)local_8b8,(PrimVar *)local_950);
                Property::Property((Property *)local_610,(Attribute *)local_8b8,false);
                Property::operator=(out_prop,(Property *)local_610);
                Property::~Property((Property *)local_610);
                uVar3 = 1;
              }
              else {
                prim = local_8f0;
                if (this_01->op_type != ResetXformStack) goto LAB_003147c1;
              }
              AttrMetas::~AttrMetas(&AStack_818);
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)local_850);
              if (local_860 != (vtable_type *)0x0) {
                (*local_860->destroy)(&local_870);
                local_860 = (vtable_type *)0x0;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_890._M_p != &local_880) {
                operator_delete(local_890._M_p,
                                CONCAT71(local_880._M_allocated_capacity._1_7_,
                                         local_880._M_local_buf[0]) + 1);
              }
              if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
                operator_delete((void *)local_8b8._0_8_,local_8b8._16_8_ + 1);
              }
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)local_930);
              if ((undefined8 *)local_940._M_allocated_capacity != (undefined8 *)0x0) {
                (**(code **)(local_940._M_allocated_capacity + 0x20))((storage_union *)local_950);
              }
              local_898 = CONCAT31(local_898._1_3_,1);
              local_8b8[0] = uVar3;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_978.dynamic != &aStack_968) {
                operator_delete(local_978.dynamic,
                                CONCAT71(aStack_968._M_allocated_capacity._1_7_,
                                         aStack_968._M_local_buf[0]) + 1);
              }
              goto LAB_00314969;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uVar14 != &aStack_968) {
              operator_delete((void *)uVar14,
                              CONCAT71(aStack_968._M_allocated_capacity._1_7_,
                                       aStack_968._M_local_buf[0]) + 1);
              op = extraout_RDX_01;
            }
            this_01 = this_01 + 1;
          } while (this_01 != pXVar2);
        }
        cVar8 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        *)(this[0x28]._matrix.m[2] + 2),local_8e8);
        if (cVar8._M_node == (_Base_ptr)(this[0x28]._matrix.m[2] + 3)) {
          local_898 = CONCAT31(local_898._1_3_,1);
          local_8b8._0_8_ = local_8b8._0_8_ & 0xffffffffffffff00;
          prim = local_8f0;
          goto LAB_00314969;
        }
        ::std::__cxx11::string::_M_assign((string *)out_prop);
        (out_prop->_attrib)._varying_authored = (bool)cVar8._M_node[3].field_0x4;
        (out_prop->_attrib)._variability = cVar8._M_node[3]._M_color;
        ::std::__cxx11::string::_M_assign((string *)&(out_prop->_attrib)._type_name);
        linb::any::operator=((any *)&(out_prop->_attrib)._var,(any *)&cVar8._M_node[4]._M_parent);
        (out_prop->_attrib)._var._blocked = SUB41(cVar8._M_node[5]._M_color,0);
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::operator=(&(out_prop->_attrib)._var._ts._samples,
                    (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&cVar8._M_node[5]._M_parent);
        (out_prop->_attrib)._var._ts._dirty = SUB41(cVar8._M_node[6]._M_color,0);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &(out_prop->_attrib)._paths,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &cVar8._M_node[6]._M_parent);
        AttrMetas::operator=(&(out_prop->_attrib)._metas,(AttrMetas *)(cVar8._M_node + 7));
        *(_Base_ptr *)&out_prop->_listOpQual = cVar8._M_node[0x17]._M_parent;
        (out_prop->_rel).type = *(Type *)&cVar8._M_node[0x17]._M_left;
        Path::operator=(&(out_prop->_rel).targetPath,(Path *)&cVar8._M_node[0x17]._M_right);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &(out_prop->_rel).targetPathVector,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &cVar8._M_node[0x1e]._M_parent);
        (out_prop->_rel).listOpQual = cVar8._M_node[0x1f]._M_color;
        AttrMetas::operator=(&(out_prop->_rel)._metas,(AttrMetas *)&cVar8._M_node[0x1f]._M_parent);
        (out_prop->_rel)._varying_authored = *(bool *)&cVar8._M_node[0x2f]._M_left;
        ::std::__cxx11::string::_M_assign((string *)&out_prop->_prop_value_type_name);
        out_prop->_has_custom = *(bool *)&cVar8._M_node[0x30]._M_right;
        prim = local_8f0;
      }
      local_898 = CONCAT31(local_898._1_3_,1);
      local_8b8[0] = 1;
    }
LAB_00314969:
    if ((bool)(undefined1)local_898 == true) {
      bVar4 = true;
      if ((value_type_conflict)local_8b8[0] != false) goto LAB_00314c60;
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_610,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_610,0x790);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_978.dynamic = &aStack_968;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_978,"Attribute `{}` does not exist in Prim {}({})","");
      local_910._16_4_ = 0x726f6658;
      local_910[0x14] = 'm';
      local_910[0x15] = '\0';
      local_910._8_8_ = 5;
      local_910._0_8_ =
           (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_910 + 0x10);
      fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                ((string *)local_950,(fmt *)&local_978,local_8e8,&(prim->_elementPath)._prim_part,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_910,
                 in_R9);
      poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_610,(char *)local_950._0_8_,local_950._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_950._0_8_ != &local_940) {
        operator_delete((void *)local_950._0_8_,local_940._M_allocated_capacity + 1);
      }
      if ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_910._0_8_ !=
          (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)(local_910 + 0x10)) {
        operator_delete((void *)local_910._0_8_,
                        CONCAT17(local_910[0x17],
                                 CONCAT16(local_910[0x16],
                                          CONCAT15(local_910[0x15],
                                                   CONCAT14(local_910[0x14],local_910._16_4_)))) + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_978.dynamic != &aStack_968) {
        operator_delete(local_978.dynamic,
                        CONCAT71(aStack_968._M_allocated_capacity._1_7_,aStack_968._M_local_buf[0])
                        + 1);
      }
      if (err == (string *)0x0) goto LAB_00314c3d;
      ::std::__cxx11::stringbuf::str();
      goto LAB_00313e94;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_610,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"GetProperty",0xb);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"():",3);
    iVar6 = 0x790;
LAB_00314ba2:
    poVar10 = (ostream *)::std::ostream::operator<<(local_610,iVar6);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    if ((bool)(undefined1)local_898 == true) {
LAB_00317bb8:
      __assert_fail("! has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/expected.hpp"
                    ,0x881,
                    "error_type &nonstd::expected_lite::expected<bool, std::basic_string<char>>::error() & [T = bool, E = std::basic_string<char>]"
                   );
    }
    poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_610,(char *)local_8b8._0_8_,local_8b8._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      goto LAB_00314c1e;
    }
  }
LAB_00314c3d:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
  ::std::ios_base::~ios_base((ios_base *)(local_5a8 + 8));
  bVar4 = false;
LAB_00314c60:
  if (((bool)(undefined1)local_898 == false) && ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10))
  {
    operator_delete((void *)local_8b8._0_8_,local_8b8._16_8_ + 1);
  }
  if (!bVar4) {
    return false;
  }
  return true;
}

Assistant:

bool GetProperty(const tinyusdz::Prim &prim, const std::string &attr_name,
                 Property *out_prop, std::string *err) {
#define GET_PRIM_PROPERTY(__ty)                                         \
  if (prim.is<__ty>()) {                                                \
    auto ret = GetPrimProperty(*prim.as<__ty>(), attr_name, out_prop);  \
    if (ret) {                                                          \
      if (!ret.value()) {                                               \
        PUSH_ERROR_AND_RETURN(                                          \
            fmt::format("Attribute `{}` does not exist in Prim {}({})", \
                        attr_name, prim.element_path().prim_part(),     \
                        value::TypeTraits<__ty>::type_name()));         \
      }                                                                 \
    } else {                                                            \
      PUSH_ERROR_AND_RETURN(ret.error());                               \
    }                                                                   \
  } else

  GET_PRIM_PROPERTY(Model)
  GET_PRIM_PROPERTY(Xform)
  GET_PRIM_PROPERTY(Scope)
  GET_PRIM_PROPERTY(GeomMesh)
  GET_PRIM_PROPERTY(GeomSubset)
  GET_PRIM_PROPERTY(Shader)
  GET_PRIM_PROPERTY(Material)
  GET_PRIM_PROPERTY(SkelRoot)
  GET_PRIM_PROPERTY(BlendShape)
  GET_PRIM_PROPERTY(Skeleton)
  GET_PRIM_PROPERTY(SkelAnimation) {
    PUSH_ERROR_AND_RETURN("TODO: Prim type " << prim.type_name());
  }

#undef GET_PRIM_PROPERTY

  return true;
}